

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsizegrip.cpp
# Opt level: O0

void __thiscall QSizeGripPrivate::updateTopLevelWidget(QSizeGripPrivate *this)

{
  long lVar1;
  bool bVar2;
  QWidget *pQVar3;
  QWidget *pQVar4;
  QSizeGripPrivate *in_RDI;
  long in_FS_OFFSET;
  QSizeGrip *q;
  QWidget *w;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = &q_func(in_RDI)->super_QWidget;
  qt_sizegrip_topLevelWidget(pQVar3);
  bVar2 = ::operator==((QPointer<QWidget> *)pQVar3,(QWidget **)in_RDI);
  if (!bVar2) {
    bVar2 = ::QPointer::operator_cast_to_bool((QPointer<QWidget> *)0x68192a);
    if (bVar2) {
      pQVar4 = QPointer<QWidget>::operator->((QPointer<QWidget> *)0x681940);
      QObject::removeEventFilter(&pQVar4->super_QObject);
    }
    QPointer<QWidget>::operator=((QPointer<QWidget> *)pQVar3,(QWidget *)in_RDI);
    bVar2 = ::QPointer::operator_cast_to_bool((QPointer<QWidget> *)0x681972);
    if (bVar2) {
      pQVar3 = QPointer<QWidget>::operator->((QPointer<QWidget> *)0x681988);
      QObject::installEventFilter(&pQVar3->super_QObject);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void updateTopLevelWidget()
    {
        Q_Q(QSizeGrip);
        QWidget *w = qt_sizegrip_topLevelWidget(q);
        if (tlw == w)
            return;
        if (tlw)
            tlw->removeEventFilter(q);
        tlw = w;
        if (tlw)
            tlw->installEventFilter(q);
    }